

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O2

void __thiscall
gimage::PNMImageIO::loadHeader(PNMImageIO *this,char *name,long *width,long *height,int *depth)

{
  int iVar1;
  IOException *this_00;
  allocator local_95;
  float scale;
  long maxval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar1 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar1 != '\0') {
    anon_unknown_11::readPNMHeader(name,depth,&maxval,&scale,width,height);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_88,name,&local_95);
  std::operator+(&local_68,"Can only load PNM image (",&local_88);
  std::operator+(&local_48,&local_68,")");
  gutil::IOException::IOException(this_00,&local_48);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PNMImageIO::loadHeader(const char *name, long &width, long &height,
                            int &depth) const
{
  long  maxval;
  float scale;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  readPNMHeader(name, depth, maxval, scale, width, height);
}